

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_setb(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGTemp *ts;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  ulong uVar1;
  TCGv_i32 ret;
  
  s = ctx->uc->tcg_ctx;
  ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)ts - (long)s);
  ts_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I32,false);
  ts_01 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I32,false);
  uVar1 = (ulong)(ctx->opcode >> 0xf & 0x38);
  tcg_gen_setcondi_i32_ppc64(s,TCG_COND_GEU,ret,*(TCGv_i32 *)((long)cpu_crf + uVar1),4);
  tcg_gen_op2_ppc64(s,INDEX_op_movi_i32,(TCGArg)ts_00,8);
  tcg_gen_op2_ppc64(s,INDEX_op_movi_i32,(TCGArg)ts_01,0xffffffffffffffff);
  tcg_gen_movcond_i32_ppc64
            (s,TCG_COND_GEU,ret,*(TCGv_i32 *)((long)cpu_crf + uVar1),
             (TCGv_i32)((long)ts_00 - (long)s),(TCGv_i32)((long)ts_01 - (long)s),ret);
  tcg_gen_ext_i32_i64_ppc64
            (s,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),ret);
  tcg_temp_free_internal_ppc64(s,ts);
  tcg_temp_free_internal_ppc64(s,ts_00);
  tcg_temp_free_internal_ppc64(s,ts_01);
  return;
}

Assistant:

static void gen_setb(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t0 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 t8 = tcg_temp_new_i32(tcg_ctx);
    TCGv_i32 tm1 = tcg_temp_new_i32(tcg_ctx);
    int crf = crfS(ctx->opcode);

    tcg_gen_setcondi_i32(tcg_ctx, TCG_COND_GEU, t0, cpu_crf[crf], 4);
    tcg_gen_movi_i32(tcg_ctx, t8, 8);
    tcg_gen_movi_i32(tcg_ctx, tm1, -1);
    tcg_gen_movcond_i32(tcg_ctx, TCG_COND_GEU, t0, cpu_crf[crf], t8, tm1, t0);
    tcg_gen_ext_i32_tl(tcg_ctx, cpu_gpr[rD(ctx->opcode)], t0);

    tcg_temp_free_i32(tcg_ctx, t0);
    tcg_temp_free_i32(tcg_ctx, t8);
    tcg_temp_free_i32(tcg_ctx, tm1);
}